

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFOutlineObjectHelper::getTitle_abi_cxx11_
          (string *__return_storage_ptr__,QPDFOutlineObjectHelper *this)

{
  bool bVar1;
  BaseHandle *pBVar2;
  allocator<char> local_79;
  QPDFObjectHandle local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68 [2];
  undefined1 local_48 [16];
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pBVar2 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_48 + 0x10),"/Title",(allocator<char> *)&local_78);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_68,(string *)(local_48 + 0x10));
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68[0]._M_refcount);
  if (bVar1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"/Title",&local_79);
    QPDFObjectHandle::getKey(&local_78,(string *)local_48);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_((string *)(local_48 + 0x10),&local_78);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_48 + 0x10));
    std::__cxx11::string::~string((string *)(local_48 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFOutlineObjectHelper::getTitle()
{
    std::string result;
    if (oh().hasKey("/Title")) {
        result = oh().getKey("/Title").getUTF8Value();
    }
    return result;
}